

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O3

void __thiscall Liby::http::HttpClient::handleConnection(HttpClient *this,ConnPtr *conn)

{
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  (this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (conn->super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(conn->super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:29:24)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:29:24)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->readEventCallback_,(function<void_(Liby::Connection_&)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:30:24)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:30:24)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->erroEventCallback_,(function<void_(Liby::Connection_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((this->requestLists_).
      super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->requestLists_) {
    sendRequest(this);
  }
  return;
}

Assistant:

void HttpClient::handleConnection(ConnPtr conn) {
    http_conn_ = conn;
    http_conn_->onRead([this](Connection &c) { handleReadEvent(c); });
    http_conn_->onErro([this](Connection &c) { handleErroEvent(c); });
    if (!requestLists_.empty())
        sendRequest();
}